

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall libcellml::Variable::VariableImpl::cleanExpiredVariables(VariableImpl *this)

{
  __weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  iterator __first;
  
  p_Var3 = &((this->mEquivalentVariables).
             super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((this->mEquivalentVariables).
             super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
  lVar4 = (long)p_Var1 - (long)p_Var3 >> 6;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    p_Var3 = p_Var3 + 2;
    do {
      __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var3;
      p_Var2 = (&(__first._M_current)->
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)[-2]._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current =
             (weak_ptr<libcellml::Variable> *)
             (&(__first._M_current)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> + -2);
        goto LAB_00293267;
      }
      p_Var2 = (&(__first._M_current)->
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)[-1]._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current =
             (weak_ptr<libcellml::Variable> *)
             (&(__first._M_current)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> + -1);
        goto LAB_00293267;
      }
      p_Var2 = ((__first._M_current)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) goto LAB_00293267;
      p_Var2 = (&(__first._M_current)->
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)[1]._M_refcount.
               _M_pi;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
        __first._M_current =
             (weak_ptr<libcellml::Variable> *)
             (&(__first._M_current)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> + 1);
        goto LAB_00293267;
      }
      lVar4 = lVar4 + -1;
      p_Var3 = &(__first._M_current)->
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> + 4;
    } while (1 < lVar4);
    p_Var3 = &(__first._M_current)->
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> + 2;
  }
  lVar4 = (long)p_Var1 - (long)p_Var3 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var1;
      if (((lVar4 != 3) ||
          (p_Var2 = (p_Var3->_M_refcount)._M_pi,
          __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var3,
          p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) ||
         (p_Var2->_M_use_count == 0)) goto LAB_00293267;
      p_Var3 = p_Var3 + 1;
    }
    p_Var2 = (p_Var3->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var3;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) goto LAB_00293267;
    p_Var3 = p_Var3 + 1;
  }
  p_Var2 = (p_Var3->_M_refcount)._M_pi;
  __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var3;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (p_Var2->_M_use_count != 0)
     ) {
    __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var1;
  }
LAB_00293267:
  p_Var3 = &(__first._M_current)->super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
           + 1;
  if (p_Var3 != p_Var1 &&
      &(__first._M_current)->super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> !=
      p_Var1) {
    do {
      p_Var2 = (p_Var3->_M_refcount)._M_pi;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (p_Var2->_M_use_count != 0)) {
        std::__weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
        __first._M_current =
             (weak_ptr<libcellml::Variable> *)
             (&(__first._M_current)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> + 1);
      }
      p_Var3 = p_Var3 + 1;
    } while (p_Var3 != p_Var1);
  }
  std::
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>::
  _M_erase(&this->mEquivalentVariables,__first,
           (this->mEquivalentVariables).
           super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void Variable::VariableImpl::cleanExpiredVariables()
{
    mEquivalentVariables.erase(std::remove_if(mEquivalentVariables.begin(), mEquivalentVariables.end(), [=](const VariableWeakPtr &variableWeak) -> bool { return variableWeak.expired(); }), mEquivalentVariables.end());
}